

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O3

Byte * __thiscall
CharStringType2Interpreter::InterpretIfelse
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  size_t *psVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  int iVar8;
  Trace *this_00;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  CharStringOperand valueB;
  CharStringOperand valueA;
  _List_node_base *local_68;
  _List_node_base *local_60;
  
  iVar8 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x27])
                    (this->mImplementationHelper,this);
  if (iVar8 != 0) {
    return (Byte *)0x0;
  }
  uVar4 = (this->mOperandStack).
          super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
          _M_size;
  if (uVar4 < 4) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting"
                      ,(this->mOperandStack).
                       super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                       _M_impl._M_node._M_size);
    return (Byte *)0x0;
  }
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  bVar2 = *(byte *)&p_Var10[1]._M_next;
  p_Var5 = p_Var10[1]._M_prev;
  (this->mOperandStack).super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
  _M_impl._M_node._M_size = uVar4 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  bVar3 = *(byte *)&p_Var10[1]._M_next;
  local_68 = p_Var10[1]._M_prev;
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  p_Var6 = p_Var10[1]._M_next;
  p_Var7 = p_Var10[1]._M_prev;
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  p_Var10 = (this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            super__List_node_base._M_prev;
  p_Var11 = p_Var10[1]._M_next;
  p_Var12 = p_Var10[1]._M_prev;
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var10,0x20);
  if ((bVar3 & bVar2 & 1) == 0) {
    local_60 = p_Var5;
    if ((bVar2 & 1) != 0) {
      local_60 = (_List_node_base *)(double)(long)p_Var5;
    }
    if ((bVar3 & 1) != 0) {
      local_68 = (_List_node_base *)(double)(long)local_68;
      local_60 = p_Var5;
    }
    p_Var9 = (_List_node_base *)operator_new(0x20);
    p_Var10 = p_Var9 + 1;
    if ((double)local_68 <= (double)local_60) goto LAB_001a1ffa;
  }
  else {
    p_Var9 = (_List_node_base *)operator_new(0x20);
    p_Var10 = p_Var9 + 1;
    if ((long)local_68 <= (long)p_Var5) goto LAB_001a1ffa;
  }
  p_Var11 = p_Var6;
  p_Var12 = p_Var7;
LAB_001a1ffa:
  p_Var10->_M_next = p_Var11;
  p_Var10->_M_prev = p_Var12;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  psVar1 = &(this->mOperandStack).
            super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretIfelse(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Ifelse(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand valueC;
	CharStringOperand valueD;

	if(mOperandStack.size() < 4) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}		

	valueD = mOperandStack.back();
	mOperandStack.pop_back();
	valueC = mOperandStack.back();
	mOperandStack.pop_back();
	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();


	if(!valueC.IsInteger || !valueD.IsInteger)
	{
		if((valueC.IsInteger ? (double)valueC.IntegerValue : valueC.RealValue) >
			(valueD.IsInteger ? (double)valueD.IntegerValue : valueD.RealValue))
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}
	else
	{
		if(valueC.IntegerValue > valueD.IntegerValue)
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}

	return inProgramCounter;
}